

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int compute_huffman_codes(zbuf *a)

{
  uint uVar1;
  int iVar2;
  int num;
  uint uVar3;
  int iVar4;
  int c;
  int s;
  int hclen;
  int hdist;
  int hlit;
  int n;
  int i;
  uint8 codelength_sizes [19];
  byte local_1e8 [8];
  uint8 lencodes [455];
  zbuf *a_local;
  
  uVar1 = zreceive(a,5);
  iVar2 = uVar1 + 0x101;
  uVar1 = zreceive(a,5);
  num = uVar1 + 1;
  uVar1 = zreceive(a,4);
  memset(&n,0,0x13);
  for (hlit = 0; hlit < (int)(uVar1 + 4); hlit = hlit + 1) {
    uVar3 = zreceive(a,3);
    *(char *)((long)&n + (ulong)compute_huffman_codes::length_dezigzag[hlit]) = (char)uVar3;
  }
  iVar4 = zbuild_huffman(&compute_huffman_codes::z_codelength,(uint8 *)&n,0x13);
  if (iVar4 == 0) {
    a_local._4_4_ = 0;
  }
  else {
    hdist = 0;
    while (hdist < iVar2 + num) {
      iVar4 = zhuffman_decode(a,&compute_huffman_codes::z_codelength);
      if ((iVar4 < 0) || (0x12 < iVar4)) {
        __assert_fail("c >= 0 && c < 19",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                      ,0x72d,"int compute_huffman_codes(zbuf *)");
      }
      if (iVar4 < 0x10) {
        local_1e8[hdist] = (byte)iVar4;
        hdist = hdist + 1;
      }
      else {
        if (iVar4 == 0x10) {
          uVar1 = zreceive(a,2);
          iVar4 = uVar1 + 3;
          memset(local_1e8 + hdist,(uint)local_1e8[hdist + -1],(long)iVar4);
        }
        else if (iVar4 == 0x11) {
          uVar1 = zreceive(a,3);
          iVar4 = uVar1 + 3;
          memset(local_1e8 + hdist,0,(long)iVar4);
        }
        else {
          if (iVar4 != 0x12) {
            __assert_fail("c == 18",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                          ,0x739,"int compute_huffman_codes(zbuf *)");
          }
          uVar1 = zreceive(a,7);
          iVar4 = uVar1 + 0xb;
          memset(local_1e8 + hdist,0,(long)iVar4);
        }
        hdist = iVar4 + hdist;
      }
    }
    if (hdist == iVar2 + num) {
      iVar4 = zbuild_huffman(&a->z_length,local_1e8,iVar2);
      if (iVar4 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        iVar2 = zbuild_huffman(&a->z_distance,local_1e8 + iVar2,num);
        if (iVar2 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          a_local._4_4_ = 1;
        }
      }
    }
    else {
      a_local._4_4_ = e("Corrupt PNG");
    }
  }
  return a_local._4_4_;
}

Assistant:

static int compute_huffman_codes(zbuf *a)
{
   static uint8 length_dezigzag[19] = { 16,17,18,0,8,7,9,6,10,5,11,4,12,3,13,2,14,1,15 };
   static zhuffman z_codelength; // static just to save stack space
   uint8 lencodes[286+32+137];//padding for maximum single op
   uint8 codelength_sizes[19];
   int i,n;

   int hlit  = zreceive(a,5) + 257;
   int hdist = zreceive(a,5) + 1;
   int hclen = zreceive(a,4) + 4;

   memset(codelength_sizes, 0, sizeof(codelength_sizes));
   for (i=0; i < hclen; ++i) {
      int s = zreceive(a,3);
      codelength_sizes[length_dezigzag[i]] = (uint8) s;
   }
   if (!zbuild_huffman(&z_codelength, codelength_sizes, 19)) return 0;

   n = 0;
   while (n < hlit + hdist) {
      int c = zhuffman_decode(a, &z_codelength);
      assert(c >= 0 && c < 19);
      if (c < 16)
         lencodes[n++] = (uint8) c;
      else if (c == 16) {
         c = zreceive(a,2)+3;
         memset(lencodes+n, lencodes[n-1], c);
         n += c;
      } else if (c == 17) {
         c = zreceive(a,3)+3;
         memset(lencodes+n, 0, c);
         n += c;
      } else {
         assert(c == 18);
         c = zreceive(a,7)+11;
         memset(lencodes+n, 0, c);
         n += c;
      }
   }
   if (n != hlit+hdist) return e("bad codelengths","Corrupt PNG");
   if (!zbuild_huffman(&a->z_length, lencodes, hlit)) return 0;
   if (!zbuild_huffman(&a->z_distance, lencodes+hlit, hdist)) return 0;
   return 1;
}